

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O3

size_t fiobj_hash_update_json(FIOBJ hash,void *data,size_t len)

{
  size_t sVar1;
  fiobj_json_parser_s p;
  json_parser_s local_68;
  FIOBJ FStack_60;
  FIOBJ local_58;
  FIOBJ FStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  void *pvStack_30;
  undefined8 local_28;
  
  if (hash == 0) {
    sVar1 = 0;
  }
  else {
    local_58 = 0;
    local_38 = 0;
    pvStack_30 = (void *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    local_68.dict = 0;
    local_68.depth = '\0';
    local_68.key = '\0';
    local_68._6_2_ = 0;
    FStack_60 = 0;
    local_28 = 0;
    FStack_50 = hash;
    sVar1 = fio_json_parse(&local_68,(char *)data,len);
    fio_free(pvStack_30);
    local_38 = 0;
    pvStack_30 = (void *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    fiobj_free(FStack_60);
    if (local_58 != hash) {
      fiobj_free(local_58);
    }
  }
  return sVar1;
}

Assistant:

size_t fiobj_hash_update_json(FIOBJ hash, const void *data, size_t len) {
  if (!hash)
    return 0;
  fiobj_json_parser_s p = {.top = FIOBJ_INVALID, .target = hash};
  size_t consumed = fio_json_parse(&p.p, data, len);
  fio_json_stack_free(&p.stack);
  fiobj_free(p.key);
  if (p.top != hash)
    fiobj_free(p.top);
  return consumed;
}